

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<long> * __thiscall
google::protobuf::util::converter::DataPiece::GenericConvert<long>
          (StatusOr<long> *__return_storage_ptr__,DataPiece *this)

{
  StringPiece default_string;
  char *pcVar1;
  ulong uVar2;
  long in_RDX;
  unsigned_long *value;
  StringPiece value_str;
  StringPiece value_str_00;
  StringPiece local_80;
  string local_70;
  unsigned_long local_50;
  undefined1 local_48 [40];
  
  switch(this->type_) {
  case TYPE_INT32:
    local_48._0_8_ = SEXT48((this->field_2).i32_);
    break;
  case TYPE_INT64:
    local_48._0_8_ = (this->field_2).i64_;
    break;
  case TYPE_UINT32:
    local_48._0_8_ = ZEXT48((this->field_2).u32_);
    break;
  case TYPE_UINT64:
    local_50 = (this->field_2).i64_;
    uVar2 = (ulong)(0 < (long)local_50) * 2 - 1;
    if (local_50 == 0) {
      uVar2 = 0;
    }
    if (uVar2 != (local_50 != 0)) {
      ValueAsString<unsigned_long>(&local_70,local_50);
      pcVar1 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
      value_str_00.length_ = uVar2;
      value_str_00.ptr_ = pcVar1;
      anon_unknown_1::InvalidArgument
                ((Status *)local_48,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str_00);
      StatusOr<long>::StatusOr(__return_storage_ptr__,(Status *)local_48);
      goto LAB_00326093;
    }
    value = &local_50;
    goto LAB_00325fe9;
  case TYPE_DOUBLE:
    (anonymous_namespace)::ValidateNumberConversion<long,double>
              (__return_storage_ptr__,(_anonymous_namespace_ *)(long)(this->field_2).double_,in_RDX,
               (this->field_2).double_);
    return __return_storage_ptr__;
  case TYPE_FLOAT:
    (anonymous_namespace)::ValidateNumberConversion<long,float>
              (__return_storage_ptr__,(_anonymous_namespace_ *)(long)(this->field_2).float_,in_RDX,
               (this->field_2).float_);
    return __return_storage_ptr__;
  default:
    StringPiece::StringPiece
              (&local_80,"Wrong type. Bool, Enum, String and Cord not supported in GenericConvert.")
    ;
    default_string.length_ = local_80.length_;
    default_string.ptr_ = local_80.ptr_;
    ValueAsStringOrDefault_abi_cxx11_(&local_70,this,default_string);
    pcVar1 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
    value_str.length_ = local_80.length_;
    value_str.ptr_ = pcVar1;
    anon_unknown_1::InvalidArgument
              ((Status *)local_48,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str);
    StatusOr<long>::StatusOr(__return_storage_ptr__,(Status *)local_48);
LAB_00326093:
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    return __return_storage_ptr__;
  }
  value = (unsigned_long *)local_48;
LAB_00325fe9:
  StatusOr<long>::StatusOr(__return_storage_ptr__,(long *)value);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> DataPiece::GenericConvert() const {
  switch (type_) {
    case TYPE_INT32:
      return NumberConvertAndCheck<To, int32>(i32_);
    case TYPE_INT64:
      return NumberConvertAndCheck<To, int64>(i64_);
    case TYPE_UINT32:
      return NumberConvertAndCheck<To, uint32>(u32_);
    case TYPE_UINT64:
      return NumberConvertAndCheck<To, uint64>(u64_);
    case TYPE_DOUBLE:
      return NumberConvertAndCheck<To, double>(double_);
    case TYPE_FLOAT:
      return NumberConvertAndCheck<To, float>(float_);
    default:  // TYPE_ENUM, TYPE_STRING, TYPE_CORD, TYPE_BOOL
      return InvalidArgument(ValueAsStringOrDefault(
          "Wrong type. Bool, Enum, String and Cord not supported in "
          "GenericConvert."));
  }
}